

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O1

void __thiscall hmi::window::window(window *this,string_view title,vec2i size,window_flags hints)

{
  int iVar1;
  SDL_Window *pSVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  string title_string;
  char local_51;
  long *local_50 [2];
  long local_40 [2];
  
  this->m_window = (SDL_Window *)0x0;
  this->m_should_close = false;
  LOCK();
  iVar1 = (anonymous_namespace)::g_loaded + 1;
  UNLOCK();
  bVar5 = (anonymous_namespace)::g_loaded == 0;
  (anonymous_namespace)::g_loaded = iVar1;
  if (bVar5) {
    iVar1 = SDL_Init(0x20);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to initialize SDL: ",0x1a);
      pcVar3 = (char *)SDL_GetError();
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1121d0);
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
      }
      local_50[0] = (long *)CONCAT71(local_50[0]._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)local_50,1);
      return;
    }
    SDL_GL_SetAttribute(0x15,4);
    SDL_GL_SetAttribute(0x11,2);
    SDL_GL_SetAttribute(0x12,0);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,title._M_str,title._M_str + title._M_len);
  pSVar2 = (SDL_Window *)
           SDL_CreateWindow(local_50[0],0x2fff0000,0x2fff0000,(ulong)size.field_0 & 0xffffffff,
                            (ulong)size.field_0 >> 0x20,
                            (hints & resizable) * 0x20 +
                            (hints & decorated) * 4 + (uint)((hints & visible) == none) * 4 + 6 ^
                            0x10);
  this->m_window = pSVar2;
  if (pSVar2 == (SDL_Window *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to create window: ",0x19);
    pcVar3 = (char *)SDL_GetError();
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1121d0);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
    }
    local_51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_51,1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

window::window(std::string_view title, vec2i size, window_flags hints)
  : m_window(nullptr)
  , m_should_close(false)
  {
    if (g_loaded.fetch_add(1) == 0) { // we are the first
      if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        std::cerr << "Unable to initialize SDL: " << SDL_GetError() << '\n';
        return;
      }

      // must be set before window creating
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_ES);
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 2);
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
    }

    std::string title_string(title);
    auto flags = compute_sdl_flags(hints);
    m_window = SDL_CreateWindow(title_string.data(), SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, size.width, size.height, flags);

    if (m_window == nullptr) {
      std::cerr << "Unable to create window: " << SDL_GetError() << '\n';
      return;
    }
  }